

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O1

void __thiscall
spv::Builder::addInstruction
          (Builder *this,unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *inst)

{
  uint uVar1;
  Block *pBVar2;
  bool bVar3;
  Id IVar4;
  Instruction *pIVar5;
  _Elt_pointer puVar6;
  Id IVar7;
  Instruction *raw_instruction;
  Instruction *raw_instruction_1;
  _Head_base<0UL,_spv::Instruction_*,_false> local_50;
  _Head_base<0UL,_spv::Instruction_*,_false> local_48;
  _Head_base<0UL,_spv::Instruction_*,_false> local_40;
  _Head_base<0UL,_spv::Instruction_*,_false> local_38;
  _Head_base<0UL,_spv::Instruction_*,_false> local_30;
  
  if (((inst->_M_t).super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>.
       _M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
       super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl)->opCode == OpPhi) {
    pBVar2 = this->buildPoint;
    pIVar5 = (inst->_M_t).
             super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
             super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
             super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl;
    (inst->_M_t).super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>.
    _M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl = (Instruction *)0x0;
    local_30._M_head_impl = pIVar5;
    std::
    vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
    ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
              ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
                *)&pBVar2->instructions,
               (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_30);
    pIVar5->block = pBVar2;
    if (pIVar5->resultId != 0) {
      Module::mapInstruction(pBVar2->parent->parent,pIVar5);
    }
    if (local_30._M_head_impl != (Instruction *)0x0) {
      (*(local_30._M_head_impl)->_vptr_Instruction[1])();
    }
  }
  else {
    if ((this->emitNonSemanticShaderDebugInfo == true) && (this->dirtyScopeTracker == true)) {
      puVar6 = (this->currentDebugScopeId).c.
               super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur;
      if (puVar6 == (this->currentDebugScopeId).c.
                    super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_first) {
        puVar6 = (this->currentDebugScopeId).c.
                 super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
      }
      bVar3 = Block::updateDebugScope(this->buildPoint,puVar6[-1]);
      if (bVar3) {
        IVar7 = this->uniqueId + 1;
        this->uniqueId = IVar7;
        IVar4 = makeVoidType(this);
        pIVar5 = (Instruction *)operator_new(0x60);
        pIVar5->_vptr_Instruction = (_func_int **)&PTR__Instruction_0093fd28;
        pIVar5->resultId = IVar7;
        pIVar5->typeId = IVar4;
        pIVar5->opCode = OpExtInst;
        (pIVar5->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        (pIVar5->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
        (pIVar5->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (pIVar5->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (pIVar5->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (pIVar5->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        (pIVar5->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
        (pIVar5->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
        pIVar5->block = (Block *)0x0;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(&pIVar5->operands,3);
        if ((pIVar5->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_end_of_storage ==
            (pIVar5->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) {
          std::vector<bool,_std::allocator<bool>_>::_M_reallocate(&pIVar5->idOperand,3);
        }
        Instruction::addIdOperand(pIVar5,this->nonSemanticShaderDebugInfo);
        Instruction::addImmediateOperand(pIVar5,0x17);
        puVar6 = (this->currentDebugScopeId).c.
                 super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_cur;
        if (puVar6 == (this->currentDebugScopeId).c.
                      super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Deque_impl_data._M_finish._M_first) {
          puVar6 = (this->currentDebugScopeId).c.
                   super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
        }
        Instruction::addIdOperand(pIVar5,puVar6[-1]);
        pBVar2 = this->buildPoint;
        local_38._M_head_impl = pIVar5;
        std::
        vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
        ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
                  ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
                    *)&pBVar2->instructions,
                   (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_38
                  );
        pIVar5->block = pBVar2;
        if (pIVar5->resultId != 0) {
          Module::mapInstruction(pBVar2->parent->parent,pIVar5);
        }
        if (local_38._M_head_impl != (Instruction *)0x0) {
          (*(local_38._M_head_impl)->_vptr_Instruction[1])();
        }
        local_38._M_head_impl = (Instruction *)0x0;
      }
      this->dirtyScopeTracker = false;
    }
    if ((this->trackDebugInfo == true) && (this->dirtyLineTracker == true)) {
      bVar3 = Block::updateDebugSourceLocation
                        (this->buildPoint,this->currentLine,0,this->currentFileId);
      if (bVar3) {
        if (this->emitSpirvDebugInfo == true) {
          pIVar5 = (Instruction *)operator_new(0x60);
          pIVar5->_vptr_Instruction = (_func_int **)&PTR__Instruction_0093fd28;
          pIVar5->resultId = 0;
          pIVar5->typeId = 0;
          pIVar5->opCode = OpLine;
          (pIVar5->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
          (pIVar5->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
          (pIVar5->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
          .super__Vector_impl_data._M_start = (pointer)0x0;
          (pIVar5->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
          .super__Vector_impl_data._M_finish = (pointer)0x0;
          (pIVar5->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (pIVar5->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
          (pIVar5->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
          (pIVar5->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
          pIVar5->block = (Block *)0x0;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(&pIVar5->operands,3);
          if ((pIVar5->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_end_of_storage ==
              (pIVar5->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) {
            std::vector<bool,_std::allocator<bool>_>::_M_reallocate(&pIVar5->idOperand,3);
          }
          Instruction::addIdOperand(pIVar5,this->currentFileId);
          Instruction::addImmediateOperand(pIVar5,this->currentLine);
          Instruction::addImmediateOperand(pIVar5,0);
          pBVar2 = this->buildPoint;
          local_40._M_head_impl = pIVar5;
          std::
          vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
          ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
                    ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
                      *)&pBVar2->instructions,
                     (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                     &local_40);
          pIVar5->block = pBVar2;
          if (pIVar5->resultId != 0) {
            Module::mapInstruction(pBVar2->parent->parent,pIVar5);
          }
          if (local_40._M_head_impl != (Instruction *)0x0) {
            (*(local_40._M_head_impl)->_vptr_Instruction[1])();
          }
          local_40._M_head_impl = (Instruction *)0x0;
        }
        if (this->emitNonSemanticShaderDebugInfo == true) {
          IVar7 = this->uniqueId + 1;
          this->uniqueId = IVar7;
          IVar4 = makeVoidType(this);
          pIVar5 = (Instruction *)operator_new(0x60);
          pIVar5->_vptr_Instruction = (_func_int **)&PTR__Instruction_0093fd28;
          pIVar5->resultId = IVar7;
          pIVar5->typeId = IVar4;
          pIVar5->opCode = OpExtInst;
          (pIVar5->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
          (pIVar5->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
          (pIVar5->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
          .super__Vector_impl_data._M_start = (pointer)0x0;
          (pIVar5->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
          .super__Vector_impl_data._M_finish = (pointer)0x0;
          (pIVar5->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (pIVar5->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
          (pIVar5->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
          (pIVar5->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
          pIVar5->block = (Block *)0x0;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(&pIVar5->operands,7);
          if ((pIVar5->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_end_of_storage ==
              (pIVar5->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) {
            std::vector<bool,_std::allocator<bool>_>::_M_reallocate(&pIVar5->idOperand,7);
          }
          Instruction::addIdOperand(pIVar5,this->nonSemanticShaderDebugInfo);
          Instruction::addImmediateOperand(pIVar5,0x67);
          IVar4 = makeDebugSource(this,this->currentFileId);
          Instruction::addIdOperand(pIVar5,IVar4);
          uVar1 = this->currentLine;
          IVar4 = makeIntegerType(this,0x20,false);
          IVar4 = makeIntConstant(this,IVar4,uVar1,false);
          Instruction::addIdOperand(pIVar5,IVar4);
          uVar1 = this->currentLine;
          IVar4 = makeIntegerType(this,0x20,false);
          IVar4 = makeIntConstant(this,IVar4,uVar1,false);
          Instruction::addIdOperand(pIVar5,IVar4);
          IVar4 = makeIntegerType(this,0x20,false);
          IVar4 = makeIntConstant(this,IVar4,0,false);
          Instruction::addIdOperand(pIVar5,IVar4);
          IVar4 = makeIntegerType(this,0x20,false);
          IVar4 = makeIntConstant(this,IVar4,0,false);
          Instruction::addIdOperand(pIVar5,IVar4);
          pBVar2 = this->buildPoint;
          local_48._M_head_impl = pIVar5;
          std::
          vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
          ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
                    ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
                      *)&pBVar2->instructions,
                     (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                     &local_48);
          pIVar5->block = pBVar2;
          if (pIVar5->resultId != 0) {
            Module::mapInstruction(pBVar2->parent->parent,pIVar5);
          }
          if (local_48._M_head_impl != (Instruction *)0x0) {
            (*(local_48._M_head_impl)->_vptr_Instruction[1])();
          }
          local_48._M_head_impl = (Instruction *)0x0;
        }
      }
      this->dirtyLineTracker = false;
    }
    pBVar2 = this->buildPoint;
    pIVar5 = (inst->_M_t).
             super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
             super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
             super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl;
    (inst->_M_t).super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>.
    _M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl = (Instruction *)0x0;
    local_50._M_head_impl = pIVar5;
    std::
    vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
    ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
              ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
                *)&pBVar2->instructions,
               (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_50);
    pIVar5->block = pBVar2;
    if (pIVar5->resultId != 0) {
      Module::mapInstruction(pBVar2->parent->parent,pIVar5);
    }
    if (local_50._M_head_impl != (Instruction *)0x0) {
      (*(local_50._M_head_impl)->_vptr_Instruction[1])();
    }
  }
  return;
}

Assistant:

void Builder::addInstruction(std::unique_ptr<Instruction> inst) {
    // Phis must appear first in their block, don't insert line tracking instructions
    // in front of them, just add the OpPhi and return.
    if (inst->getOpCode() == OpPhi) {
        buildPoint->addInstruction(std::move(inst));
        return;
    }
    // Optionally insert OpDebugScope
    if (emitNonSemanticShaderDebugInfo && dirtyScopeTracker) {
        if (buildPoint->updateDebugScope(currentDebugScopeId.top())) {
            auto scopeInst = std::make_unique<Instruction>(getUniqueId(), makeVoidType(), OpExtInst);
            scopeInst->reserveOperands(3);
            scopeInst->addIdOperand(nonSemanticShaderDebugInfo);
            scopeInst->addImmediateOperand(NonSemanticShaderDebugInfo100DebugScope);
            scopeInst->addIdOperand(currentDebugScopeId.top());
            buildPoint->addInstruction(std::move(scopeInst));
        }

        dirtyScopeTracker = false;
    }

    // Insert OpLine/OpDebugLine if the debug source location has changed
    if (trackDebugInfo && dirtyLineTracker) {
        if (buildPoint->updateDebugSourceLocation(currentLine, 0, currentFileId)) {
            if (emitSpirvDebugInfo) {
                auto lineInst = std::make_unique<Instruction>(OpLine);
                lineInst->reserveOperands(3);
                lineInst->addIdOperand(currentFileId);
                lineInst->addImmediateOperand(currentLine);
                lineInst->addImmediateOperand(0);
                buildPoint->addInstruction(std::move(lineInst));
            }
            if (emitNonSemanticShaderDebugInfo) {
                auto lineInst = std::make_unique<Instruction>(getUniqueId(), makeVoidType(), OpExtInst);
                lineInst->reserveOperands(7);
                lineInst->addIdOperand(nonSemanticShaderDebugInfo);
                lineInst->addImmediateOperand(NonSemanticShaderDebugInfo100DebugLine);
                lineInst->addIdOperand(makeDebugSource(currentFileId));
                lineInst->addIdOperand(makeUintConstant(currentLine));
                lineInst->addIdOperand(makeUintConstant(currentLine));
                lineInst->addIdOperand(makeUintConstant(0));
                lineInst->addIdOperand(makeUintConstant(0));
                buildPoint->addInstruction(std::move(lineInst));
            }
        }

        dirtyLineTracker = false;
    }

    buildPoint->addInstruction(std::move(inst));
}